

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkAig.c
# Opt level: O0

Nwk_Man_t *
Nwk_ManCreateFromGia
          (Gia_Man_t *p,Vec_Int_t *vPPis,Vec_Int_t *vNodes,Vec_Int_t *vLeaves,Vec_Int_t **pvMapInv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int b;
  Nwk_Man_t *p_00;
  char *pcVar4;
  Vec_Int_t *p_01;
  undefined8 *__ptr;
  Nwk_Obj_t *pNVar5;
  bool bVar6;
  int local_74;
  int local_54;
  int i;
  Vec_Int_t *vMaps;
  Gia_Obj_t *pObj;
  Nwk_Obj_t **ppCopies;
  Nwk_Man_t *pNtk;
  Vec_Int_t **pvMapInv_local;
  Vec_Int_t *vLeaves_local;
  Vec_Int_t *vNodes_local;
  Vec_Int_t *vPPis_local;
  Gia_Man_t *p_local;
  
  Gia_ManCreateRefs(p);
  p_00 = Nwk_ManAlloc();
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  p_00->nFanioPlus = 0;
  Hop_ManStop(p_00->pManHop);
  p_00->pManHop = (Hop_Man_t *)0x0;
  iVar1 = Vec_IntSize(vNodes);
  iVar2 = Vec_IntSize(vPPis);
  iVar3 = Vec_IntSize(vLeaves);
  iVar2 = Abc_MaxInt(iVar2,iVar3);
  p_01 = Vec_IntAlloc(iVar1 + iVar2 + 1);
  iVar1 = Gia_ManObjNum(p);
  __ptr = (undefined8 *)malloc((long)iVar1 << 3);
  vMaps = (Vec_Int_t *)Gia_ManConst0(p);
  iVar1 = Gia_ObjRefNum(p,(Gia_Obj_t *)vMaps);
  iVar2 = Vec_IntSize(vLeaves);
  iVar3 = Vec_IntSize(vPPis);
  if (iVar3 < iVar2) {
    local_74 = Vec_IntSize(vLeaves);
    iVar2 = Vec_IntSize(vPPis);
    local_74 = local_74 - iVar2;
  }
  else {
    local_74 = 0;
  }
  pNVar5 = Nwk_ManCreateNode(p_00,0,iVar1 + local_74);
  iVar1 = Gia_ObjId(p,(Gia_Obj_t *)vMaps);
  __ptr[iVar1] = pNVar5;
  iVar1 = Gia_ObjId(p,(Gia_Obj_t *)vMaps);
  Vec_IntPush(p_01,iVar1);
  local_54 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vLeaves);
    bVar6 = false;
    if (local_54 < iVar1) {
      iVar1 = Vec_IntEntry(vLeaves,local_54);
      vMaps = (Vec_Int_t *)Gia_ManObj(p,iVar1);
      bVar6 = vMaps != (Vec_Int_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjRefNum(p,(Gia_Obj_t *)vMaps);
    pNVar5 = Nwk_ManCreateCi(p_00,iVar1);
    iVar1 = Gia_ObjId(p,(Gia_Obj_t *)vMaps);
    __ptr[iVar1] = pNVar5;
    iVar1 = Vec_IntSize(p_01);
    iVar2 = Gia_ObjId(p,(Gia_Obj_t *)vMaps);
    iVar2 = Nwk_ObjId((Nwk_Obj_t *)__ptr[iVar2]);
    if (iVar1 != iVar2) {
      __assert_fail("Vec_IntSize(vMaps) == Nwk_ObjId(ppCopies[Gia_ObjId(p,pObj)])",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkAig.c"
                    ,0xb1,
                    "Nwk_Man_t *Nwk_ManCreateFromGia(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t **)"
                   );
    }
    iVar1 = Gia_ObjId(p,(Gia_Obj_t *)vMaps);
    Vec_IntPush(p_01,iVar1);
    local_54 = local_54 + 1;
  }
  for (local_54 = Vec_IntSize(vLeaves); iVar1 = Vec_IntSize(vPPis), local_54 < iVar1;
      local_54 = local_54 + 1) {
    Nwk_ManCreateCi(p_00,0);
    Vec_IntPush(p_01,-1);
  }
  local_54 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vNodes);
    bVar6 = false;
    if (local_54 < iVar1) {
      iVar1 = Vec_IntEntry(vNodes,local_54);
      vMaps = (Vec_Int_t *)Gia_ManObj(p,iVar1);
      bVar6 = vMaps != (Vec_Int_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjRefNum(p,(Gia_Obj_t *)vMaps);
    pNVar5 = Nwk_ManCreateNode(p_00,2,iVar1);
    iVar1 = Gia_ObjId(p,(Gia_Obj_t *)vMaps);
    __ptr[iVar1] = pNVar5;
    iVar1 = Gia_ObjId(p,(Gia_Obj_t *)vMaps);
    pNVar5 = (Nwk_Obj_t *)__ptr[iVar1];
    iVar1 = Gia_ObjFaninId0p(p,(Gia_Obj_t *)vMaps);
    Nwk_ObjAddFanin(pNVar5,(Nwk_Obj_t *)__ptr[iVar1]);
    iVar1 = Gia_ObjId(p,(Gia_Obj_t *)vMaps);
    pNVar5 = (Nwk_Obj_t *)__ptr[iVar1];
    iVar1 = Gia_ObjFaninId1p(p,(Gia_Obj_t *)vMaps);
    Nwk_ObjAddFanin(pNVar5,(Nwk_Obj_t *)__ptr[iVar1]);
    iVar1 = Vec_IntSize(p_01);
    iVar2 = Gia_ObjId(p,(Gia_Obj_t *)vMaps);
    iVar2 = Nwk_ObjId((Nwk_Obj_t *)__ptr[iVar2]);
    if (iVar1 != iVar2) {
      __assert_fail("Vec_IntSize(vMaps) == Nwk_ObjId(ppCopies[Gia_ObjId(p,pObj)])",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkAig.c"
                    ,0xbe,
                    "Nwk_Man_t *Nwk_ManCreateFromGia(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t **)"
                   );
    }
    iVar1 = Gia_ObjId(p,(Gia_Obj_t *)vMaps);
    Vec_IntPush(p_01,iVar1);
    local_54 = local_54 + 1;
  }
  local_54 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vPPis);
    bVar6 = false;
    if (local_54 < iVar1) {
      iVar1 = Vec_IntEntry(vPPis,local_54);
      vMaps = (Vec_Int_t *)Gia_ManObj(p,iVar1);
      bVar6 = vMaps != (Vec_Int_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjId(p,(Gia_Obj_t *)vMaps);
    if (__ptr[iVar1] == 0) {
      __assert_fail("ppCopies[Gia_ObjId(p,pObj)] != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkAig.c"
                    ,0xc3,
                    "Nwk_Man_t *Nwk_ManCreateFromGia(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t **)"
                   );
    }
    pNVar5 = Nwk_ManCreateCo(p_00);
    iVar1 = Gia_ObjId(p,(Gia_Obj_t *)vMaps);
    Nwk_ObjAddFanin(pNVar5,(Nwk_Obj_t *)__ptr[iVar1]);
    local_54 = local_54 + 1;
  }
  for (local_54 = Vec_IntSize(vPPis); iVar1 = Vec_IntSize(vLeaves), local_54 < iVar1;
      local_54 = local_54 + 1) {
    pNVar5 = Nwk_ManCreateCo(p_00);
    Nwk_ObjAddFanin(pNVar5,(Nwk_Obj_t *)*__ptr);
  }
  iVar1 = Vec_IntSize(p_01);
  iVar2 = Vec_IntSize(vNodes);
  iVar3 = Vec_IntSize(vPPis);
  b = Vec_IntSize(vLeaves);
  iVar3 = Abc_MaxInt(iVar3,b);
  if (iVar1 != iVar2 + iVar3 + 1) {
    __assert_fail("Vec_IntSize(vMaps) == Vec_IntSize(vNodes) + Abc_MaxInt(Vec_IntSize(vPPis), Vec_IntSize(vLeaves)) + 1"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkAig.c"
                  ,200,
                  "Nwk_Man_t *Nwk_ManCreateFromGia(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t **)"
                 );
  }
  if (__ptr != (undefined8 *)0x0) {
    free(__ptr);
  }
  *pvMapInv = p_01;
  return p_00;
}

Assistant:

Nwk_Man_t * Nwk_ManCreateFromGia( Gia_Man_t * p, Vec_Int_t * vPPis, Vec_Int_t * vNodes, Vec_Int_t * vLeaves, Vec_Int_t ** pvMapInv )
{
    Nwk_Man_t * pNtk;
    Nwk_Obj_t ** ppCopies;
    Gia_Obj_t * pObj;
    Vec_Int_t * vMaps;
    int i;
//    assert( Vec_IntSize(vLeaves) >= Vec_IntSize(vPPis) );
    Gia_ManCreateRefs( p );
    pNtk = Nwk_ManAlloc();
    pNtk->pName = Abc_UtilStrsav( p->pName );
    pNtk->nFanioPlus = 0;
    Hop_ManStop( pNtk->pManHop );
    pNtk->pManHop = NULL;
    // allocate
    vMaps = Vec_IntAlloc( Vec_IntSize(vNodes) + Abc_MaxInt(Vec_IntSize(vPPis), Vec_IntSize(vLeaves)) + 1 );
    ppCopies = ABC_ALLOC( Nwk_Obj_t *, Gia_ManObjNum(p) );
    // copy objects
    pObj = Gia_ManConst0(p);
//    ppCopies[Gia_ObjId(p,pObj)] = Nwk_ManCreateNode( pNtk, 0, Gia_ObjRefNum(p,pObj) );
    ppCopies[Gia_ObjId(p,pObj)] = Nwk_ManCreateNode( pNtk, 0, Gia_ObjRefNum(p,pObj) + (Vec_IntSize(vLeaves) > Vec_IntSize(vPPis) ? Vec_IntSize(vLeaves) - Vec_IntSize(vPPis) : 0) );
    Vec_IntPush( vMaps, Gia_ObjId(p,pObj) );
    Gia_ManForEachObjVec( vLeaves, p, pObj, i )
    {
        ppCopies[Gia_ObjId(p,pObj)] = Nwk_ManCreateCi( pNtk, Gia_ObjRefNum(p,pObj) );
        assert( Vec_IntSize(vMaps) == Nwk_ObjId(ppCopies[Gia_ObjId(p,pObj)]) );
        Vec_IntPush( vMaps, Gia_ObjId(p,pObj) );
    }
    for ( i = Vec_IntSize(vLeaves); i < Vec_IntSize(vPPis); i++ )
    {
        Nwk_ManCreateCi( pNtk, 0 );
        Vec_IntPush( vMaps, -1 );
    }
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
    {
        ppCopies[Gia_ObjId(p,pObj)] = Nwk_ManCreateNode( pNtk, 2, Gia_ObjRefNum(p,pObj) );
        Nwk_ObjAddFanin( ppCopies[Gia_ObjId(p,pObj)], ppCopies[Gia_ObjFaninId0p(p,pObj)] );
        Nwk_ObjAddFanin( ppCopies[Gia_ObjId(p,pObj)], ppCopies[Gia_ObjFaninId1p(p,pObj)] );
        assert( Vec_IntSize(vMaps) == Nwk_ObjId(ppCopies[Gia_ObjId(p,pObj)]) );
        Vec_IntPush( vMaps, Gia_ObjId(p,pObj) );
    }
    Gia_ManForEachObjVec( vPPis, p, pObj, i )
    {
        assert( ppCopies[Gia_ObjId(p,pObj)] != NULL );
        Nwk_ObjAddFanin( Nwk_ManCreateCo(pNtk), ppCopies[Gia_ObjId(p,pObj)] );
    }
    for ( i = Vec_IntSize(vPPis); i < Vec_IntSize(vLeaves); i++ )
        Nwk_ObjAddFanin( Nwk_ManCreateCo(pNtk), ppCopies[0] );
    assert( Vec_IntSize(vMaps) == Vec_IntSize(vNodes) + Abc_MaxInt(Vec_IntSize(vPPis), Vec_IntSize(vLeaves)) + 1 );
    ABC_FREE( ppCopies );
    *pvMapInv = vMaps;
    return pNtk;
}